

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

void __thiscall sf::Texture::setRepeated(Texture *this,bool repeated)

{
  ostream *poVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TransientContextLock lock;
  TextureSaver save;
  TransientContextLock local_15;
  TextureSaver local_14;
  
  if ((this->m_isRepeated != repeated) && (this->m_isRepeated = repeated, this->m_texture != 0)) {
    GlResource::TransientContextLock::TransientContextLock(&local_15);
    priv::TextureSaver::TextureSaver(&local_14);
    if (setRepeated(bool)::textureEdgeClamp == '\0') {
      setRepeated();
    }
    if (((this->m_isRepeated == false) && (setRepeated::textureEdgeClamp == false)) &&
       (setRepeated(bool)::warned == '\0')) {
      poVar1 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"OpenGL extension SGIS_texture_edge_clamp unavailable",0x34);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      poVar1 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"Artifacts may occur along texture edges",0x27);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      poVar1 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"Ensure that hardware acceleration is enabled if available",0x39);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      setRepeated(bool)::warned = '\x01';
    }
    glBindTexture(0xde1,this->m_texture);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2a6,"glBindTexture(GL_TEXTURE_2D, m_texture)");
    uVar2 = 0x2900;
    if ((setRepeated::textureEdgeClamp & 1U) != 0) {
      uVar2 = 0x812f;
    }
    uVar3 = 0x2901;
    if (this->m_isRepeated == false) {
      uVar3 = uVar2;
    }
    glTexParameteri(0xde1,0x2802,uVar3);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2a7,
                       "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                      );
    uVar2 = 0x2900;
    if ((setRepeated::textureEdgeClamp & 1U) != 0) {
      uVar2 = 0x812f;
    }
    uVar3 = 0x2901;
    if (this->m_isRepeated == false) {
      uVar3 = uVar2;
    }
    glTexParameteri(0xde1,0x2803,uVar3);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2a8,
                       "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                      );
    priv::TextureSaver::~TextureSaver(&local_14);
    GlResource::TransientContextLock::~TransientContextLock(&local_15);
  }
  return;
}

Assistant:

void Texture::setRepeated(bool repeated)
{
    if (repeated != m_isRepeated)
    {
        m_isRepeated = repeated;

        if (m_texture)
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            static bool textureEdgeClamp = GLEXT_texture_edge_clamp || GLEXT_EXT_texture_edge_clamp;

            if (!m_isRepeated && !textureEdgeClamp)
            {
                static bool warned = false;

                if (!warned)
                {
                    err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
                    err() << "Artifacts may occur along texture edges" << std::endl;
                    err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

                    warned = true;
                }
            }

            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
        }
    }
}